

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O2

int sort_rooms_ring_comp(void *va,void *vb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  
  iVar6 = *(int *)((long)va + 4);
  iVar1 = *(int *)((long)va + 8);
  iVar8 = *(int *)((long)va + 0xc) + iVar6;
  iVar2 = *(int *)((long)vb + 4);
  iVar3 = *(int *)((long)vb + 8);
  iVar10 = *(int *)((long)vb + 0xc) + iVar2;
  bVar4 = *(int *)((long)va + 0x10) + iVar1 < 0x14;
  bVar5 = bVar4 * '\x03';
  if (iVar8 < 0x4f) {
    bVar5 = bVar4 + 1;
  }
  bVar4 = *(int *)((long)vb + 0x10) + iVar3 < 0x14;
  bVar7 = bVar4 * '\x03';
  if (iVar10 < 0x4f) {
    bVar7 = bVar4 + 1;
  }
  if (bVar5 != bVar7) {
    return -(uint)(bVar5 < bVar7) | 1;
  }
  uVar9 = iVar8 - 0x4f;
  uVar11 = iVar10 - 0x4f;
  if (2 < uVar11 || 2 < uVar9) {
    if (uVar11 < 3 || uVar9 < 3) {
      return -(uint)(uVar9 < 3) | 1;
    }
    iVar10 = (((*(int *)((long)va + 0x10) + iVar1 + -0x15) / 2) * 0x50) /
             ((*(int *)((long)va + 0xc) + iVar6 + -0x50) / 2);
    iVar8 = (((*(int *)((long)vb + 0x10) + iVar3 + -0x15) / 2) * 0x50) /
            ((*(int *)((long)vb + 0xc) + iVar2 + -0x50) / 2);
    if (iVar10 != iVar8) {
      return (uint)(iVar8 <= iVar10) * 2 + -1;
    }
  }
  iVar6 = iVar6 - iVar2;
  if (iVar6 == 0) {
    iVar6 = iVar1 - iVar3;
  }
  return iVar6;
}

Assistant:

static int sort_rooms_ring_comp(const void *va, const void *vb)
{
	const struct sort_rooms_data *a, *b;
	int ax, ay, bx, by;	/* x and y relative to map center */
	int aquad, bquad;	/* quadrants of rooms */

	a = (const struct sort_rooms_data *)va;
	b = (const struct sort_rooms_data *)vb;

	ax = (a->lx + a->hx - COLNO) / 2;
	bx = (b->lx + b->hx - COLNO) / 2;
	ay = (a->ly + a->hy - ROWNO) / 2;
	by = (b->ly + b->hy - ROWNO) / 2;

	/*
	 * Avoid expensive sqrt/atan2 calls by comparing
	 * quadrants and tangents directly.
	 *
	 *  2 | 3
	 * ---+---
	 *  1 | 0
	 */
	aquad = (ax >= 0) ? (ay >= 0 ? 0 : 3) : (ay >= 0 ? 1 : 2);
	bquad = (bx >= 0) ? (by >= 0 ? 0 : 3) : (by >= 0 ? 1 : 2);

	if (aquad != bquad)
	    return (aquad < bquad) ? -1 : 1;

	/* Same quad? Compare tan values: ay/ax vs. by/bx */
	if (ax == 0 && bx == 0) {
	    /* Avoid unstable sort effects across qsort implementations. */
	    return sort_rooms_standard_comp(va, vb);
	} else if (ax == 0) {
	    return -1;
	} else if (bx == 0) {
	    return 1;
	} else {
	    /* COLNO factor (longer level axis) to reduce rounding errors */
	    int ayx = COLNO * ay / ax;
	    int byx = COLNO * by / bx;
	    if (ayx == byx) {
		/* Again, avoid implementation qsort instability. */
		return sort_rooms_standard_comp(va, vb);
	    } else if (ayx < byx) {
		return -1;
	    } else {
		return 1;
	    }
	}
}